

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderStructTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderStructTests::init(ShaderStructTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  ShaderStructTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  LocalStructTests::LocalStructTests
            ((LocalStructTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  UniformStructTests::UniformStructTests
            ((UniformStructTests *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void ShaderStructTests::init (void)
{
	addChild(new LocalStructTests(m_testCtx));
	addChild(new UniformStructTests(m_testCtx));
}